

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterDropShadow.cpp
# Opt level: O3

bool __thiscall
Rml::FilterDropShadow::Initialise
          (FilterDropShadow *this,Colourb in_color,NumericValue in_offset_x,NumericValue in_offset_y
          ,NumericValue in_sigma)

{
  this->color = in_color;
  (this->value_offset_x).number = in_offset_x.number;
  (this->value_offset_x).unit = in_offset_x.unit;
  (this->value_offset_y).number = in_offset_y.number;
  (this->value_offset_y).unit = in_offset_y.unit;
  (this->value_sigma).number = in_sigma.number;
  (this->value_sigma).unit = in_sigma.unit;
  if (((ulong)in_offset_y & 0x3fbc000000000) != 0 && ((ulong)in_offset_x & 0x3fbc000000000) != 0) {
    return ((ulong)in_sigma & 0x3fbc000000000) != 0;
  }
  return false;
}

Assistant:

bool FilterDropShadow::Initialise(Colourb in_color, NumericValue in_offset_x, NumericValue in_offset_y, NumericValue in_sigma)
{
	color = in_color;
	value_offset_x = in_offset_x;
	value_offset_y = in_offset_y;
	value_sigma = in_sigma;
	return Any(in_offset_x.unit & Unit::LENGTH) && Any(in_offset_y.unit & Unit::LENGTH) && Any(in_sigma.unit & Unit::LENGTH);
}